

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_10::appendUnchanged
                  (UChar *dest,int32_t destIndex,int32_t destCapacity,UChar *s,int32_t length,
                  uint32_t options,Edits *edits)

{
  uint32_t options_local;
  int32_t length_local;
  UChar *s_local;
  int32_t destCapacity_local;
  int32_t destIndex_local;
  UChar *dest_local;
  
  dest_local._4_4_ = destIndex;
  if (0 < length) {
    dest_local._4_4_ = appendNonEmptyUnchanged(dest,destIndex,destCapacity,s,length,options,edits);
  }
  return dest_local._4_4_;
}

Assistant:

inline int32_t
appendUnchanged(UChar *dest, int32_t destIndex, int32_t destCapacity,
                const UChar *s, int32_t length, uint32_t options, icu::Edits *edits) {
    if (length <= 0) {
        return destIndex;
    }
    return appendNonEmptyUnchanged(dest, destIndex, destCapacity, s, length, options, edits);
}